

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O1

void sysbvm_jit_callWithContextNoResult3
               (sysbvm_bytecodeJit_t *jit,void *functionPointer,int16_t argumentOperand0,
               int16_t argumentOperand1,int16_t argumentOperand2)

{
  int32_t iVar1;
  uint8_t local_2f [4];
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  
  iVar1 = jit->contextPointerOffset;
  local_2f[0] = 'H';
  local_2f[1] = 0x8b;
  local_2f[2] = 0xbd;
  local_2f[3] = (uint8_t)iVar1;
  local_2b = (undefined1)((uint)iVar1 >> 8);
  local_2a = (undefined1)((uint)iVar1 >> 0x10);
  local_29 = (undefined1)((uint)iVar1 >> 0x18);
  sysbvm_bytecodeJit_addBytes(jit,7,local_2f);
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG1,argumentOperand0);
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG2,argumentOperand1);
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG3,argumentOperand2);
  sysbvm_jit_x86_call(jit,functionPointer);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_callWithContextNoResult3(sysbvm_bytecodeJit_t *jit, void *functionPointer, int16_t argumentOperand0, int16_t argumentOperand1, int16_t argumentOperand2)
{
    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);
    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG1, argumentOperand0);
    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG2, argumentOperand1);
    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG3, argumentOperand2);
    sysbvm_jit_x86_call(jit, functionPointer);
}